

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall
CVmObjVector::getp_get_unique(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *this_00;
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  uint16_t tmp;
  
  if (getp_get_unique(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_unique();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_unique::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar5->val).obj = self;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    vVar7 = create(0,(ulong)uVar1);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar5 = sp_;
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar2;
    this_00 = G_obj_table_X.pages_[(retval->val).obj >> 0xc] + ((retval->val).obj & 0xfff);
    *(ushort *)(*(char **)((long)&this_00->ptr_ + 8) + 2) = uVar1;
    memcpy(*(char **)((long)&this_00->ptr_ + 8) + 4,
           (this->super_CVmObjCollection).super_CVmObject.ext_ + 4,(ulong)uVar1 * 5);
    cons_uniquify((CVmObjVector *)this_00);
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_get_unique(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    CVmObjVector *new_vec;
    size_t cnt;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* put myself on the stack for GC protection */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate a new vector for the return value - the new vector will
     *   never be any larger than the original 
     */
    cnt = get_element_count();
    retval->set_obj(create(vmg_ FALSE, cnt));

    /* push a reference to the new list for gc protection */
    G_stk->push(retval);

    /* get the return value as a vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* start out with the result element count the same as my own */
    new_vec->set_element_count(cnt);

    /* copy my elements to the new vector */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(cnt));

    /* uniquify the result */
    new_vec->cons_uniquify(vmg0_);

    /* discard the gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}